

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_info_test_helper.cc
# Opt level: O1

void __thiscall
google::protobuf::util::converter::testing::TypeInfoTestHelper::ResetTypeInfo
          (TypeInfoTestHelper *this,Descriptor *descriptor)

{
  Descriptor *local_30;
  Descriptor *descriptor_local;
  vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  descriptors;
  
  descriptor_local = (Descriptor *)0x0;
  descriptors.
  super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  descriptors.
  super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_30 = descriptor;
  std::
  vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>::
  _M_realloc_insert<google::protobuf::Descriptor_const*const&>
            ((vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>
              *)&descriptor_local,(iterator)0x0,&local_30);
  ResetTypeInfo(this,(vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                      *)&descriptor_local);
  if (descriptor_local != (Descriptor *)0x0) {
    operator_delete(descriptor_local);
  }
  return;
}

Assistant:

void TypeInfoTestHelper::ResetTypeInfo(const Descriptor* descriptor) {
  std::vector<const Descriptor*> descriptors;
  descriptors.push_back(descriptor);
  ResetTypeInfo(descriptors);
}